

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O0

void pce_pal(int *ip)

{
  int iVar1;
  int *ip_local;
  
  labldef(loccnt,1);
  if (lastlabl == (t_symbol *)0x0) {
    error("No label!");
  }
  else {
    iVar1 = evaluate(ip,';');
    if (iVar1 != 0) {
      if (value < 0x10) {
        lastlabl->pal = value;
        if (pass == 1) {
          loadlc(value,1);
          println();
        }
      }
      else {
        error("Incorrect palette index!");
      }
    }
  }
  return;
}

Assistant:

void
pce_pal(int *ip)
{
	/* define label */
	labldef(loccnt, 1);

	/* check if there's a label */
	if (lastlabl == NULL) {
		error("No label!");
		return;
	}

	/* get the palette index */
	if (!evaluate(ip, ';'))
		return;
	if (value > 15) {
		error("Incorrect palette index!");
		return;
	}
	lastlabl->pal = value;

	/* output line */
	if (pass == LAST_PASS) {
		loadlc(value, 1);
		println();
	}
}